

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lockedpool.cpp
# Opt level: O2

size_t __thiscall PosixLockedPageAllocator::GetLimit(PosixLockedPageAllocator *this)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  rlimit rlim;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = getrlimit(__RLIMIT_MEMLOCK,(rlimit *)&rlim);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return -(ulong)(iVar2 != 0) | rlim.rlim_cur;
  }
  __stack_chk_fail();
}

Assistant:

size_t PosixLockedPageAllocator::GetLimit()
{
#ifdef RLIMIT_MEMLOCK
    struct rlimit rlim;
    if (getrlimit(RLIMIT_MEMLOCK, &rlim) == 0) {
        if (rlim.rlim_cur != RLIM_INFINITY) {
            return rlim.rlim_cur;
        }
    }
#endif
    return std::numeric_limits<size_t>::max();
}